

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool DerBase::DecodeSetOrSequenceOf<PolicyInformation>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<PolicyInformation,_std::allocator<PolicyInformation>_> *out)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  overflow_error *this;
  bool bVar6;
  undefined1 local_c8 [8];
  PolicyInformation t;
  size_t local_50;
  size_t cbElement;
  size_t *local_40;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  std::vector<PolicyInformation,_std::allocator<PolicyInformation>_>::_M_erase_at_end
            (out,*(pointer *)out);
  t.policyQualifiers.super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIn;
  cbElement = (size_t)cbSize;
  local_40 = cbPrefix;
  bVar2 = DecodeSequenceOrSet(type,pIn,cbIn,cbPrefix,cbSize,local_31);
  if (bVar2) {
    sVar4 = 2;
    if (local_31[0] == false) {
      sVar4 = *local_40;
      uVar5 = *(long *)cbElement + sVar4;
      do {
        local_50 = 0;
        t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        local_c8 = (undefined1  [8])&PTR_EncodedSize_00150eb8;
        t.policyIdentifier.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151908;
        t.policyIdentifier.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        t.policyIdentifier.super_DerBase.cbData = 0;
        t.policyIdentifier.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        t.policyQualifiers.
        super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.policyIdentifier.oidIndex = 0;
        t.policyQualifiers.
        super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (uVar5 < sVar4) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar3 = PolicyInformation::Decode
                          ((PolicyInformation *)local_c8,
                           (uchar *)((long)&((t.policyQualifiers.
                                              super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            super_DerBase)._vptr_DerBase + sVar4),uVar5 - sVar4,
                           &local_50);
        sVar1 = local_50;
        if (bVar3) {
          std::vector<PolicyInformation,_std::allocator<PolicyInformation>_>::push_back
                    (out,(value_type *)local_c8);
          sVar4 = sVar4 + sVar1;
          bVar6 = sVar4 == *local_40 + *(long *)cbElement;
          bVar3 = !bVar6;
          bVar2 = (bool)(bVar6 | bVar2);
        }
        else {
          bVar2 = false;
          if (local_50 == 0) {
            *local_40 = 0;
            *(undefined8 *)cbElement = 0;
          }
          bVar3 = false;
        }
        std::vector<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>::~vector
                  ((vector<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_> *)
                   &t.policyIdentifier.oidIndex);
        if (t.policyIdentifier.super_DerBase.cbData != 0) {
          operator_delete((void *)t.policyIdentifier.super_DerBase.cbData);
        }
      } while (bVar3);
      return bVar2;
    }
  }
  else {
    sVar4 = 0;
  }
  *local_40 = sVar4;
  *(undefined8 *)cbElement = 0;
  return bVar2;
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}